

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprism.cpp
# Opt level: O1

void pztopology::TPZPrism::ComputeHDivDirections<double>
               (TPZFMatrix<double> *gradx,TPZFMatrix<double> *directions)

{
  long lVar1;
  long lVar2;
  int i;
  long lVar3;
  long lVar4;
  int i_2;
  bool bVar5;
  double dVar6;
  TPZManVector<double,_3> NormalScales;
  TPZManVector<double,_3> v2;
  TPZManVector<double,_3> v1;
  TPZManVector<double,_3> v3;
  TPZManVector<double,_3> v3vdiag;
  TPZManVector<double,_3> vdiag;
  TPZManVector<double,_3> v2v3;
  TPZManVector<double,_3> v3v1;
  TPZManVector<double,_3> v1v2;
  TPZManVector<double,_3> vec3;
  TPZManVector<double,_3> vec2;
  TPZManVector<double,_3> vec1;
  TPZManVector<double,_3> local_2d8;
  TPZManVector<double,_3> local_2a0;
  TPZManVector<double,_3> local_268;
  TPZManVector<double,_3> local_230;
  double local_1f8;
  TPZManVector<double,_3> local_1f0;
  TPZManVector<double,_3> local_1b8;
  TPZManVector<double,_3> local_180;
  TPZManVector<double,_3> local_148;
  TPZManVector<double,_3> local_110;
  TPZManVector<double,_3> local_d8;
  TPZManVector<double,_3> local_a0;
  TPZManVector<double,_3> local_68;
  
  dVar6 = TPZAxesTools<double>::ComputeDetjac(gradx);
  TPZManVector<double,_3>::TPZManVector(&local_268,3);
  TPZManVector<double,_3>::TPZManVector(&local_2a0,3);
  TPZManVector<double,_3>::TPZManVector(&local_230,3);
  TPZManVector<double,_3>::TPZManVector(&local_110,3);
  TPZManVector<double,_3>::TPZManVector(&local_148,3);
  TPZManVector<double,_3>::TPZManVector(&local_180,3);
  TPZManVector<double,_3>::TPZManVector(&local_68,3);
  TPZManVector<double,_3>::TPZManVector(&local_a0,3);
  TPZManVector<double,_3>::TPZManVector(&local_d8,3);
  TPZManVector<double,_3>::TPZManVector(&local_1b8,3);
  TPZManVector<double,_3>::TPZManVector(&local_1f0,3);
  lVar3 = 0;
  do {
    if (((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar3) ||
       ((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_268.super_TPZVec<double>.fStore[lVar3] = gradx->fElem[lVar3];
    if (((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar3) ||
       ((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    local_2a0.super_TPZVec<double>.fStore[lVar3] = gradx->fElem[lVar4 + lVar3];
    if ((lVar4 <= lVar3) || ((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    local_230.super_TPZVec<double>.fStore[lVar3] = gradx->fElem[lVar4 * 2 + lVar3];
    if ((lVar4 <= lVar3) || ((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar3) ||
       ((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_1b8.super_TPZVec<double>.fStore[lVar3] =
         gradx->fElem[lVar3] -
         gradx->fElem[(gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow + lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  TPZNumeric::ProdVetorial<double>
            (&local_268.super_TPZVec<double>,&local_2a0.super_TPZVec<double>,
             &local_110.super_TPZVec<double>);
  TPZNumeric::ProdVetorial<double>
            (&local_2a0.super_TPZVec<double>,&local_230.super_TPZVec<double>,
             &local_180.super_TPZVec<double>);
  TPZNumeric::ProdVetorial<double>
            (&local_230.super_TPZVec<double>,&local_268.super_TPZVec<double>,
             &local_148.super_TPZVec<double>);
  TPZNumeric::ProdVetorial<double>
            (&local_230.super_TPZVec<double>,&local_1b8.super_TPZVec<double>,
             &local_1f0.super_TPZVec<double>);
  TPZNumeric::Norm<double>(&local_110.super_TPZVec<double>);
  TPZNumeric::Norm<double>(&local_180.super_TPZVec<double>);
  TPZNumeric::Norm<double>(&local_148.super_TPZVec<double>);
  TPZNumeric::Norm<double>(&local_1f0.super_TPZVec<double>);
  local_1f8 = 1.0;
  TPZManVector<double,_3>::TPZManVector(&local_2d8,4,&local_1f8);
  lVar3 = 0;
  do {
    local_268.super_TPZVec<double>.fStore[lVar3] =
         local_268.super_TPZVec<double>.fStore[lVar3] / dVar6;
    local_2a0.super_TPZVec<double>.fStore[lVar3] =
         local_2a0.super_TPZVec<double>.fStore[lVar3] / dVar6;
    local_230.super_TPZVec<double>.fStore[lVar3] =
         local_230.super_TPZVec<double>.fStore[lVar3] / dVar6;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  lVar3 = 0;
  while( true ) {
    lVar4 = 0x22;
    do {
      if (((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar3) ||
         ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar4 + -0x22)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      directions->fElem[lVar1 * (lVar4 + -0x22) + lVar3] =
           *local_2d8.super_TPZVec<double>.fStore * local_230.super_TPZVec<double>.fStore[lVar3] *
           -6.0;
      if ((lVar1 <= lVar3) ||
         ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar4)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      directions->fElem
      [(directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar4 + lVar3] =
           local_230.super_TPZVec<double>.fStore[lVar3] * *local_2d8.super_TPZVec<double>.fStore *
           6.0;
      bVar5 = lVar4 != 0x28;
      lVar4 = lVar4 + 1;
    } while (bVar5);
    if (((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar3) ||
       ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 8)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 7 + lVar3] =
         local_2a0.super_TPZVec<double>.fStore[lVar3] * -2.0 *
         local_2d8.super_TPZVec<double>.fStore[2];
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 9)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 8 + lVar3] =
         ((local_268.super_TPZVec<double>.fStore[lVar3] -
          local_2a0.super_TPZVec<double>.fStore[lVar3]) +
         (local_268.super_TPZVec<double>.fStore[lVar3] -
         local_2a0.super_TPZVec<double>.fStore[lVar3])) * local_2d8.super_TPZVec<double>.fStore[2];
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 10)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 9 + lVar3] =
         ((local_268.super_TPZVec<double>.fStore[lVar3] -
          local_2a0.super_TPZVec<double>.fStore[lVar3]) +
         (local_268.super_TPZVec<double>.fStore[lVar3] -
         local_2a0.super_TPZVec<double>.fStore[lVar3])) * local_2d8.super_TPZVec<double>.fStore[2];
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xb))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 10 + lVar3] =
         local_2a0.super_TPZVec<double>.fStore[lVar3] * -2.0 *
         local_2d8.super_TPZVec<double>.fStore[2];
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 8)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 9)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar1 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xc))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar2 * 0xb + lVar3] =
         (directions->fElem[lVar4 * 7 + lVar3] + directions->fElem[lVar1 * 8 + lVar3]) * 0.5;
    if ((lVar2 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xd))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0xc + lVar3] =
         ((local_268.super_TPZVec<double>.fStore[lVar3] -
          local_2a0.super_TPZVec<double>.fStore[lVar3]) +
         (local_268.super_TPZVec<double>.fStore[lVar3] -
         local_2a0.super_TPZVec<double>.fStore[lVar3])) * local_2d8.super_TPZVec<double>.fStore[2];
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 10)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xb))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar1 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xe))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar2 * 0xd + lVar3] =
         (directions->fElem[lVar4 * 9 + lVar3] + directions->fElem[lVar1 * 10 + lVar3]) * 0.5;
    if ((lVar2 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xf))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0xe + lVar3] =
         local_2a0.super_TPZVec<double>.fStore[lVar3] * -2.0 *
         local_2d8.super_TPZVec<double>.fStore[2];
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xd))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xf))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar1 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x10))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar2 * 0xf + lVar3] =
         (directions->fElem[lVar4 * 0xc + lVar3] + directions->fElem[lVar1 * 0xe + lVar3]) * 0.5;
    if ((lVar2 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x11))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0x10 + lVar3] =
         (local_268.super_TPZVec<double>.fStore[lVar3] +
         local_268.super_TPZVec<double>.fStore[lVar3]) * local_2d8.super_TPZVec<double>.fStore[3];
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x12))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0x11 + lVar3] =
         (local_2a0.super_TPZVec<double>.fStore[lVar3] +
         local_2a0.super_TPZVec<double>.fStore[lVar3]) * local_2d8.super_TPZVec<double>.fStore[3];
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x13))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0x12 + lVar3] =
         (local_2a0.super_TPZVec<double>.fStore[lVar3] +
         local_2a0.super_TPZVec<double>.fStore[lVar3]) * local_2d8.super_TPZVec<double>.fStore[3];
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x14))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0x13 + lVar3] =
         (local_268.super_TPZVec<double>.fStore[lVar3] +
         local_268.super_TPZVec<double>.fStore[lVar3]) * local_2d8.super_TPZVec<double>.fStore[3];
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x11))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x12))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar1 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x15))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar2 * 0x14 + lVar3] =
         (directions->fElem[lVar4 * 0x10 + lVar3] + directions->fElem[lVar1 * 0x11 + lVar3]) * 0.5;
    if ((lVar2 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x16))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0x15 + lVar3] =
         (local_2a0.super_TPZVec<double>.fStore[lVar3] +
         local_2a0.super_TPZVec<double>.fStore[lVar3]) * local_2d8.super_TPZVec<double>.fStore[3];
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x13))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x14))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar1 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x17))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar2 * 0x16 + lVar3] =
         (directions->fElem[lVar4 * 0x12 + lVar3] + directions->fElem[lVar1 * 0x13 + lVar3]) * 0.5;
    if ((lVar2 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x18))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0x17 + lVar3] =
         (local_268.super_TPZVec<double>.fStore[lVar3] +
         local_268.super_TPZVec<double>.fStore[lVar3]) * local_2d8.super_TPZVec<double>.fStore[3];
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x16))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x18))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar1 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x19))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar2 * 0x18 + lVar3] =
         (directions->fElem[lVar4 * 0x15 + lVar3] + directions->fElem[lVar1 * 0x17 + lVar3]) * 0.5;
    if ((lVar2 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x1a))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0x19 + lVar3] =
         local_268.super_TPZVec<double>.fStore[lVar3] * -2.0 *
         local_2d8.super_TPZVec<double>.fStore[1];
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x1b))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0x1a + lVar3] =
         ((local_2a0.super_TPZVec<double>.fStore[lVar3] -
          local_268.super_TPZVec<double>.fStore[lVar3]) +
         (local_2a0.super_TPZVec<double>.fStore[lVar3] -
         local_268.super_TPZVec<double>.fStore[lVar3])) * local_2d8.super_TPZVec<double>.fStore[1];
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x1c))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0x1b + lVar3] =
         ((local_2a0.super_TPZVec<double>.fStore[lVar3] -
          local_268.super_TPZVec<double>.fStore[lVar3]) +
         (local_2a0.super_TPZVec<double>.fStore[lVar3] -
         local_268.super_TPZVec<double>.fStore[lVar3])) * local_2d8.super_TPZVec<double>.fStore[1];
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x1d))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0x1c + lVar3] =
         local_268.super_TPZVec<double>.fStore[lVar3] * -2.0 *
         local_2d8.super_TPZVec<double>.fStore[1];
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x1a))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x1b))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar1 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x1e))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar2 * 0x1d + lVar3] =
         (directions->fElem[lVar4 * 0x19 + lVar3] + directions->fElem[lVar1 * 0x1a + lVar3]) * 0.5;
    if ((lVar2 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x1f))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0x1e + lVar3] =
         ((local_2a0.super_TPZVec<double>.fStore[lVar3] -
          local_268.super_TPZVec<double>.fStore[lVar3]) +
         (local_2a0.super_TPZVec<double>.fStore[lVar3] -
         local_268.super_TPZVec<double>.fStore[lVar3])) * local_2d8.super_TPZVec<double>.fStore[1];
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x1c))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x1d))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar1 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x20))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar2 * 0x1f + lVar3] =
         (directions->fElem[lVar4 * 0x1b + lVar3] + directions->fElem[lVar1 * 0x1c + lVar3]) * 0.5;
    if ((lVar2 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x21))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0x20 + lVar3] =
         local_268.super_TPZVec<double>.fStore[lVar3] * -2.0 *
         local_2d8.super_TPZVec<double>.fStore[1];
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x1f))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x21))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar1 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x22))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar2 * 0x21 + lVar3] =
         (directions->fElem[lVar4 * 0x1e + lVar3] + directions->fElem[lVar1 * 0x20 + lVar3]) * 0.5;
    if ((lVar2 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x2a))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0x29 + lVar3] =
         (local_268.super_TPZVec<double>.fStore[lVar3] +
         local_268.super_TPZVec<double>.fStore[lVar3]) * local_2d8.super_TPZVec<double>.fStore[1];
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x2b))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0x2a + lVar3] =
         (local_2a0.super_TPZVec<double>.fStore[lVar3] -
         local_268.super_TPZVec<double>.fStore[lVar3]) * 0.5;
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x2c))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0x2b + lVar3] =
         local_2a0.super_TPZVec<double>.fStore[lVar3] * -2.0 *
         local_2d8.super_TPZVec<double>.fStore[2];
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x2d))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0x2c + lVar3] =
         local_230.super_TPZVec<double>.fStore[lVar3] * *local_2d8.super_TPZVec<double>.fStore;
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x2e))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0x2d + lVar3] =
         local_230.super_TPZVec<double>.fStore[lVar3] * *local_2d8.super_TPZVec<double>.fStore;
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x2f))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0x2e + lVar3] =
         local_230.super_TPZVec<double>.fStore[lVar3] * *local_2d8.super_TPZVec<double>.fStore;
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x30))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0x2f + lVar3] =
         (local_268.super_TPZVec<double>.fStore[lVar3] +
         local_268.super_TPZVec<double>.fStore[lVar3]) * local_2d8.super_TPZVec<double>.fStore[1];
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x31))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0x30 + lVar3] =
         (local_2a0.super_TPZVec<double>.fStore[lVar3] -
         local_268.super_TPZVec<double>.fStore[lVar3]) * 0.5;
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x32))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0x31 + lVar3] =
         local_2a0.super_TPZVec<double>.fStore[lVar3] * -2.0 *
         local_2d8.super_TPZVec<double>.fStore[2];
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x33))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0x32 + lVar3] =
         (local_268.super_TPZVec<double>.fStore[lVar3] +
         local_268.super_TPZVec<double>.fStore[lVar3]) * local_2d8.super_TPZVec<double>.fStore[1];
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x34))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0x33 + lVar3] =
         (local_2a0.super_TPZVec<double>.fStore[lVar3] +
         local_2a0.super_TPZVec<double>.fStore[lVar3]) * local_2d8.super_TPZVec<double>.fStore[2];
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x35))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0x34 + lVar3] =
         (local_268.super_TPZVec<double>.fStore[lVar3] +
         local_268.super_TPZVec<double>.fStore[lVar3]) * local_2d8.super_TPZVec<double>.fStore[1] *
         0.5;
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x36))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0x35 + lVar3] =
         local_230.super_TPZVec<double>.fStore[lVar3] * *local_2d8.super_TPZVec<double>.fStore;
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x37))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0x36 + lVar3] =
         (local_2a0.super_TPZVec<double>.fStore[lVar3] -
         local_268.super_TPZVec<double>.fStore[lVar3]) * 0.5;
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x38))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0x37 + lVar3] =
         local_230.super_TPZVec<double>.fStore[lVar3] * *local_2d8.super_TPZVec<double>.fStore;
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x39))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0x38 + lVar3] =
         (local_2a0.super_TPZVec<double>.fStore[lVar3] +
         local_2a0.super_TPZVec<double>.fStore[lVar3]) * local_2d8.super_TPZVec<double>.fStore[2] *
         0.5;
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x3a))
    break;
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0x39 + lVar3] =
         local_230.super_TPZVec<double>.fStore[lVar3] * *local_2d8.super_TPZVec<double>.fStore;
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x3b))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0x3a + lVar3] =
         (local_268.super_TPZVec<double>.fStore[lVar3] +
         local_268.super_TPZVec<double>.fStore[lVar3]) * local_2d8.super_TPZVec<double>.fStore[1];
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x3c))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0x3b + lVar3] =
         (local_2a0.super_TPZVec<double>.fStore[lVar3] +
         local_2a0.super_TPZVec<double>.fStore[lVar3]) * local_2d8.super_TPZVec<double>.fStore[2];
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x3d))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0x3c + lVar3] =
         (local_268.super_TPZVec<double>.fStore[lVar3] +
         local_268.super_TPZVec<double>.fStore[lVar3]) * local_2d8.super_TPZVec<double>.fStore[1];
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x3e))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0x3d + lVar3] =
         (local_2a0.super_TPZVec<double>.fStore[lVar3] +
         local_2a0.super_TPZVec<double>.fStore[lVar3]) * local_2d8.super_TPZVec<double>.fStore[2];
    if ((lVar4 <= lVar3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x3f))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    directions->fElem[(directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 0x3e + lVar3]
         = local_230.super_TPZVec<double>.fStore[lVar3] * *local_2d8.super_TPZVec<double>.fStore;
    lVar3 = lVar3 + 1;
    if (lVar3 == 3) {
      TPZManVector<double,_3>::~TPZManVector(&local_2d8);
      TPZManVector<double,_3>::~TPZManVector(&local_1f0);
      TPZManVector<double,_3>::~TPZManVector(&local_1b8);
      TPZManVector<double,_3>::~TPZManVector(&local_d8);
      TPZManVector<double,_3>::~TPZManVector(&local_a0);
      TPZManVector<double,_3>::~TPZManVector(&local_68);
      TPZManVector<double,_3>::~TPZManVector(&local_180);
      TPZManVector<double,_3>::~TPZManVector(&local_148);
      TPZManVector<double,_3>::~TPZManVector(&local_110);
      TPZManVector<double,_3>::~TPZManVector(&local_230);
      TPZManVector<double,_3>::~TPZManVector(&local_2a0);
      TPZManVector<double,_3>::~TPZManVector(&local_268);
      return;
    }
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZPrism::ComputeHDivDirections(TPZFMatrix<TVar> &gradx, TPZFMatrix<TVar> &directions)
    {
        TVar detjac = TPZAxesTools<TVar>::ComputeDetjac(gradx);
        
        TPZManVector<TVar,3> v1(3),v2(3),v3(3),v1v2(3),v3v1(3),v2v3(3),vec1(3),vec2(3),vec3(3), vdiag(3), v3vdiag(3);
        for (int i=0; i<3; i++) {
            v1[i] = gradx(i,0);
            v2[i] = gradx(i,1);
            v3[i] = gradx(i,2);
            vdiag[i] = (gradx(i,0)-gradx(i,1));
        }

        
        TPZNumeric::ProdVetorial(v1,v2,v1v2);
        TPZNumeric::ProdVetorial(v2,v3,v2v3);
        TPZNumeric::ProdVetorial(v3,v1,v3v1);
        TPZNumeric::ProdVetorial(v3,vdiag,v3vdiag);
        
        TVar Nv1v2 = TPZNumeric::Norm(v1v2);
        TVar Nv2v3 = TPZNumeric::Norm(v2v3);
        TVar Nv3v1 = TPZNumeric::Norm(v3v1);
        TVar Nv3vdiag = TPZNumeric::Norm(v3vdiag);
        
        /**
         * @file
         * @brief Computing mapped vector with scaling factor equal 1.0.
         * using contravariant piola mapping.
         */
        TPZManVector<TVar,3> NormalScales(4,1.);
        
        
        {
            Nv1v2 = 1.;
            Nv2v3 = 2.;
            Nv3v1 = 2.;
            Nv3vdiag = 2.;
        }
        
        
        for (int i=0; i<3; i++) {
            v1[i] /= detjac;
            v2[i] /= detjac;
            v3[i] /= detjac;
        }
        for (int i=0; i<3; i++)
        {
            for (int iv=0; iv<7; iv++)
            {
                directions(i,iv) = -v3[i]*NormalScales[0]*6.;
                directions(i,iv+34) = v3[i]*NormalScales[0]*6.;
            }
            //face 1
            directions(i,7) = -v2[i]*Nv3v1*NormalScales[2];
            directions(i,8) = (v1[i]-v2[i])*Nv3v1*NormalScales[2];
            directions(i,9) = (v1[i]-v2[i])*Nv3v1*NormalScales[2];
            directions(i,10) = -v2[i]*Nv3v1*NormalScales[2];
            directions(i,11) = ( directions(i,7)+directions(i,8) )/2.;
            directions(i,12) = (v1[i]-v2[i])*Nv3v1*NormalScales[2];
            directions(i,13) = ( directions(i,9)+directions(i,10) )/2.;
            directions(i,14) = -v2[i]*Nv3v1*NormalScales[2];
            directions(i,15) = ( directions(i,12)+directions(i,14) )/2.;
            //face 2
            directions(i,16) = v1[i]*Nv3vdiag*NormalScales[3];
            directions(i,17) = v2[i]*Nv3vdiag*NormalScales[3];
            directions(i,18) = v2[i]*Nv3vdiag*NormalScales[3];
            directions(i,19) = v1[i]*Nv3vdiag*NormalScales[3];
            directions(i,20) = (directions(i,16) + directions(i,17))/2.;
            directions(i,21) = v2[i]*Nv3vdiag*NormalScales[3];
            directions(i,22) = (directions(i,18) + directions(i,19))/2.;
            directions(i,23) = v1[i]*Nv3vdiag*NormalScales[3];
            directions(i,24) = (directions(i,21) + directions(i,23))/2.;
            //face 3
            directions(i,25) = -v1[i]*Nv2v3*NormalScales[1];
            directions(i,26) = (v2[i]-v1[i])*Nv2v3*NormalScales[1];
            directions(i,27) = (v2[i]-v1[i])*Nv2v3*NormalScales[1];
            directions(i,28) = -v1[i]*Nv2v3*NormalScales[1];
            directions(i,29) = ( directions(i,25)+directions(i,26) )/2.;
            directions(i,30) = (v2[i]-v1[i])*Nv2v3*NormalScales[1];
            directions(i,31) = ( directions(i,27)+directions(i,28) )/2.;
            directions(i,32) = -v1[i]*Nv2v3*NormalScales[1];
            directions(i,33) = ( directions(i,30)+directions(i,32) )/2.;
            
            //arestas
            directions(i,41) = v1[i]*Nv2v3*NormalScales[1];//
            directions(i,42) = (v2[i]-v1[i])/2.;//*Nvdiag
            directions(i,43) = -v2[i]*Nv3v1*NormalScales[2];//
            
            directions(i,44) = v3[i]*Nv1v2*NormalScales[0];
            directions(i,45) = v3[i]*Nv1v2*NormalScales[0];
            directions(i,46) = v3[i]*Nv1v2*NormalScales[0];
            
            directions(i,47) = v1[i]*Nv2v3*NormalScales[1];//
            directions(i,48) = (v2[i]-v1[i])/2.;//*Nvdiag
            directions(i,49) = -v2[i]*Nv3v1*NormalScales[2];//
            
            // internal in faces
            directions(i,50) = v1[i]*Nv2v3*NormalScales[1];
            directions(i,51) = v2[i]*Nv3v1*NormalScales[2];
            directions(i,52) = v1[i]*Nv2v3*NormalScales[1]/2.;//
            directions(i,53) = v3[i]*Nv1v2*NormalScales[0];
            directions(i,54) = (v2[i]-v1[i])/2.;//*Nvdiag
            directions(i,55) = v3[i]*Nv1v2*NormalScales[0];
            directions(i,56) = v2[i]*Nv3v1*NormalScales[2]/2.;
            directions(i,57) = v3[i]*Nv1v2*NormalScales[0];
            directions(i,58) = v1[i]*Nv2v3*NormalScales[1];
            directions(i,59) = v2[i]*Nv3v1*NormalScales[2];
            
            
            directions(i,60) = v1[i]*Nv2v3*NormalScales[1];
            directions(i,61) = v2[i]*Nv3v1*NormalScales[2];
            directions(i,62) = v3[i]*Nv1v2*NormalScales[0];
            
        }
        
    }